

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v11::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  char *pcVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  char *buf_ptr;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *ptr;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  char buf [7];
  anon_class_8_1_54a39806 decode;
  char local_50 [8];
  anon_class_8_1_54a39806 local_48;
  char *local_40;
  wchar_t *local_38;
  
  ptr = (char *)s.size_;
  pcVar7 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (wchar_t *)0x0;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>.grow_ =
       basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_>::grow;
  local_38 = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = local_38;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar6 = pcVar7;
  local_48.f.this = (anon_class_8_1_8991fb9c_for_f)(anon_class_8_1_8991fb9c_for_f)this;
  if ((char *)0x3 < ptr) {
    pcVar1 = pcVar7 + (long)ptr;
    pcVar4 = pcVar7;
    local_40 = ptr;
    do {
      buf_ptr = pcVar4;
      pcVar6 = buf_ptr;
      if (pcVar1 + -3 <= buf_ptr) break;
      pcVar4 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/build_O1/_deps/fmt-src/include/fmt/format-inl.h:1412:25)>
               ::anon_class_8_1_54a39806::operator()(&local_48,buf_ptr,ptr);
      ptr = extraout_RDX;
      pcVar6 = (char *)0x0;
    } while (pcVar4 != (char *)0x0);
    ptr = local_40;
    if (buf_ptr < pcVar1 + -3) goto LAB_0046daae;
  }
  lVar9 = (long)(pcVar7 + (long)ptr) - (long)pcVar6;
  if (lVar9 != 0) {
    lVar5 = 0;
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[0] = '\0';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    do {
      local_50[lVar5] = pcVar6[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar9 != lVar5);
    pcVar6 = local_50;
    do {
      pcVar6 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/build_O1/_deps/fmt-src/include/fmt/format-inl.h:1412:25)>
               ::anon_class_8_1_54a39806::operator()(&local_48,pcVar6,ptr);
      if (pcVar6 == (char *)0x0) break;
      ptr = extraout_RDX_00;
    } while (pcVar6 < local_50 + lVar9);
  }
LAB_0046daae:
  uVar8 = (this->buffer_).super_buffer<wchar_t>.size_ + 1;
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ < uVar8) {
    (*(this->buffer_).super_buffer<wchar_t>.grow_)((buffer<wchar_t> *)this,uVar8);
  }
  pwVar2 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
  (this->buffer_).super_buffer<wchar_t>.size_ = sVar3 + 1;
  pwVar2[sVar3] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}